

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86.cpp
# Opt level: O2

int __thiscall ncnn::ELU_x86::forward_inplace(ELU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  undefined1 (*pauVar6) [16];
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar9 = 0;
  uVar4 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar4 = uVar9;
  }
  for (; uVar9 != uVar4; uVar9 = uVar9 + 1) {
    pvVar1 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    pauVar6 = (undefined1 (*) [16])(sVar3 * uVar9 * sVar2 + (long)pvVar1);
    fVar11 = (this->super_ELU).alpha;
    lVar10 = 0;
    for (iVar8 = 0; iVar8 + 3 < iVar7; iVar8 = iVar8 + 4) {
      auVar20 = minps(*pauVar6,ZEXT816(0));
      auVar21._8_4_ = 0x42b0c0a5;
      auVar21._0_8_ = 0x42b0c0a542b0c0a5;
      auVar21._12_4_ = 0x42b0c0a5;
      auVar21 = minps(auVar20,auVar21);
      auVar20._8_4_ = 0xc2b0c0a5;
      auVar20._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar20._12_4_ = 0xc2b0c0a5;
      auVar21 = maxps(auVar21,auVar20);
      fVar16 = auVar21._0_4_ * 1.442695 + 0.5;
      fVar17 = auVar21._4_4_ * 1.442695 + 0.5;
      fVar18 = auVar21._8_4_ * 1.442695 + 0.5;
      fVar19 = auVar21._12_4_ * 1.442695 + 0.5;
      fVar12 = (float)(int)fVar16;
      fVar13 = (float)(int)fVar17;
      fVar14 = (float)(int)fVar18;
      fVar15 = (float)(int)fVar19;
      fVar12 = fVar12 - (float)(-(uint)(fVar16 < fVar12) & 0x3f800000);
      fVar13 = fVar13 - (float)(-(uint)(fVar17 < fVar13) & 0x3f800000);
      fVar14 = fVar14 - (float)(-(uint)(fVar18 < fVar14) & 0x3f800000);
      fVar15 = fVar15 - (float)(-(uint)(fVar19 < fVar15) & 0x3f800000);
      fVar16 = fVar12 * -0.6931472 + auVar21._0_4_;
      fVar17 = fVar13 * -0.6931472 + auVar21._4_4_;
      fVar18 = fVar14 * -0.6931472 + auVar21._8_4_;
      fVar19 = fVar15 * -0.6931472 + auVar21._12_4_;
      auVar21 = maxps(*pauVar6,ZEXT816(0));
      *(float *)*pauVar6 =
           ((float)((int)fVar12 * 0x800000 + 0x3f800000) *
            (fVar16 + 1.0 +
            (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
              0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5) * fVar16 * fVar16) + -1.0) *
           fVar11 + auVar21._0_4_;
      *(float *)(*pauVar6 + 4) =
           ((float)((int)fVar13 * 0x800000 + 0x3f800000) *
            (fVar17 + 1.0 +
            (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
              0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5) * fVar17 * fVar17) + -1.0) *
           fVar11 + auVar21._4_4_;
      *(float *)(*pauVar6 + 8) =
           ((float)((int)fVar14 * 0x800000 + 0x3f800000) *
            (fVar18 + 1.0 +
            (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
              0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5) * fVar18 * fVar18) + -1.0) *
           fVar11 + auVar21._8_4_;
      *(float *)(*pauVar6 + 0xc) =
           ((float)((int)fVar15 * 0x800000 + 0x3f800000) *
            (fVar19 + 1.0 +
            (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
              0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5) * fVar19 * fVar19) + -1.0) *
           fVar11 + auVar21._12_4_;
      pauVar6 = pauVar6 + 1;
      lVar10 = lVar10 + 4;
    }
    lVar5 = sVar3 * sVar2 * uVar9;
    for (; (int)lVar10 < iVar7; lVar10 = lVar10 + 1) {
      fVar11 = *(float *)((long)pvVar1 + lVar10 * 4 + lVar5);
      if (fVar11 < 0.0) {
        fVar11 = expf(fVar11);
        *(float *)((long)pvVar1 + lVar10 * 4 + lVar5) = (fVar11 + -1.0) * (this->super_ELU).alpha;
      }
    }
  }
  return 0;
}

Assistant:

int ELU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = alpha * (expf(*ptr) - 1.f);
            ptr++;
        }
    }

    return 0;
}